

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ShapeFunctions
          (ChElementTetraCorot_10 *this,ShapeVector *N,double r,double s,double t)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM2_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = s;
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = r;
  dVar1 = ((1.0 - r) - s) - t;
  auVar6 = ZEXT816(0xbff0000000000000);
  auVar7 = ZEXT816(0x4000000000000000);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar2 = vfmadd213sd_fma(auVar7,auVar5,auVar6);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[0] =
       dVar1 * auVar2._0_8_;
  auVar2 = vfmadd213sd_fma(auVar7,auVar3._0_16_,auVar6);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[1] =
       auVar2._0_8_ * r;
  auVar2 = vfmadd213sd_fma(auVar7,auVar4._0_16_,auVar6);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[2] =
       auVar2._0_8_ * s;
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = t;
  auVar2 = vfmadd213sd_fma(auVar7,auVar2,auVar6);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[3] =
       auVar2._0_8_ * t;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[4] =
       dVar1 * 4.0 * r;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[5] =
       r * 4.0 * s;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[6] =
       s * 4.0 * dVar1;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[7] =
       dVar1 * 4.0 * t;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[8] =
       r * 4.0 * t;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array[9] =
       s * 4.0 * t;
  return;
}

Assistant:

void ChElementTetraCorot_10::ShapeFunctions(ShapeVector& N, double r, double s, double t) {
    double u = 1.0 - r - s - t;

    // at corners
    N(0) = u * (2.0 * u - 1.0);
    N(1) = r * (2.0 * r - 1.0);
    N(2) = s * (2.0 * s - 1.0);
    N(3) = t * (2.0 * t - 1.0);
    // at mid edge
    N(4) = 4.0 * u * r;
    N(5) = 4.0 * r * s;
    N(6) = 4.0 * s * u;
    N(7) = 4.0 * u * t;
    N(8) = 4.0 * r * t;
    N(9) = 4.0 * s * t;
}